

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>::iterator,_bool>
* __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
::find_or_prepare_insert<google::protobuf::FieldDescriptor_const*>
          (pair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>::iterator,_bool>
           *__return_storage_ptr__,
          raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FieldDescriptor_const*,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FieldDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FieldDescriptor_const*const,std::unique_ptr<google::protobuf::TextFormat::FastFieldValuePrinter_const,std::default_delete<google::protobuf::TextFormat::FastFieldValuePrinter_const>>>>>
          *this,FieldDescriptor **key)

{
  bool bVar1;
  
  AssertOnFind<google::protobuf::FieldDescriptor_const*>(this,key);
  bVar1 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
          ::is_soo((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<const_google::protobuf::FieldDescriptor_*,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Hash,_absl::lts_20250127::container_internal::HashEq<const_google::protobuf::FieldDescriptor_*,_void>::Eq,_std::allocator<std::pair<const_google::protobuf::FieldDescriptor_*const,_std::unique_ptr<const_google::protobuf::TextFormat::FastFieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FastFieldValuePrinter>_>_>_>_>
                    *)this);
  if (bVar1) {
    find_or_prepare_insert_soo<google::protobuf::FieldDescriptor_const*>
              (__return_storage_ptr__,this,key);
  }
  else {
    find_or_prepare_insert_non_soo<google::protobuf::FieldDescriptor_const*>
              (__return_storage_ptr__,this,key);
  }
  return __return_storage_ptr__;
}

Assistant:

std::pair<iterator, bool> find_or_prepare_insert(const K& key) {
    AssertOnFind(key);
    if (is_soo()) return find_or_prepare_insert_soo(key);
    return find_or_prepare_insert_non_soo(key);
  }